

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::SelectionEvaluator::createSelectionSets(SelectionEvaluator *this)

{
  SelectionSet *in_RDI;
  SelectionSet *unaff_retaddr;
  SelectionSet *ss;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  SelectionSet *nbits;
  
  nbits = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,
             (vector<int,_std::allocator<int>_> *)in_RDI);
  SelectionSet::SelectionSet(unaff_retaddr,(vector<int,_std::allocator<int>_> *)nbits);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::createSelectionSets() {
    SelectionSet ss(nObjects);
    return ss;
  }